

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O3

size_t reserve_space_for_data_in_tmp
                 (estate s,FFSBuffer buf,void *data,size_t length,int req_alignment,
                 size_t *tmp_data_loc)

{
  int iVar1;
  internal_iovec *piVar2;
  size_t sVar3;
  size_t tmp_data;
  size_t local_20;
  
  sVar3 = allocate_tmp_space(s,buf,length,req_alignment,&local_20);
  if (length != 0) {
    piVar2 = s->iovec;
    iVar1 = s->iovcnt;
    piVar2[iVar1].iov_len = length;
    piVar2[iVar1].iov_offset = local_20;
    piVar2[iVar1].iov_base = (void *)0x0;
    s->iovcnt = iVar1 + 1;
  }
  if (tmp_data_loc != (size_t *)0x0) {
    *tmp_data_loc = local_20;
  }
  return sVar3;
}

Assistant:

size_t
reserve_space_for_data_in_tmp(estate s, FFSBuffer buf, void *data, size_t length, int req_alignment, size_t *tmp_data_loc)
{
    size_t tmp_data;
    size_t msg_offset = allocate_tmp_space(s, buf, length, req_alignment, &tmp_data);
    if (length != 0) {
	s->iovec[s->iovcnt].iov_len = length;
	s->iovec[s->iovcnt].iov_offset = tmp_data;
	s->iovec[s->iovcnt].iov_base = NULL;
	s->iovcnt++;
    }
    if (tmp_data_loc) *tmp_data_loc = tmp_data;
    return msg_offset;
}